

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts5CsrPoslist(Fts5Cursor *pCsr,int iPhrase,u8 **pa,int *pn)

{
  Fts5Sorter *pFVar1;
  int iVar2;
  int local_64;
  int i1;
  Fts5Sorter *pSorter;
  char *z;
  int n;
  int i;
  Fts5PoslistPopulator *aPopulator;
  int bLive;
  int rc;
  Fts5Config *pConfig;
  int *pn_local;
  u8 **pa_local;
  Fts5Cursor *pFStack_10;
  int iPhrase_local;
  Fts5Cursor *pCsr_local;
  
  _bLive = (pCsr->base).pVtab[1].pModule;
  aPopulator._4_4_ = 0;
  aPopulator._0_4_ = (uint)(pCsr->pSorter == (Fts5Sorter *)0x0);
  pConfig = (Fts5Config *)pn;
  pn_local = (int *)pa;
  pa_local._4_4_ = iPhrase;
  pFStack_10 = pCsr;
  if ((pCsr->csrflags & 0x40U) != 0) {
    if (*(int *)((long)&_bLive->xColumn + 4) != 0) {
      _n = sqlite3Fts5ExprClearPoslists(pCsr->pExpr,(uint)aPopulator);
      if (_n == (Fts5PoslistPopulator *)0x0) {
        aPopulator._4_4_ = 7;
      }
      for (z._4_4_ = 0; z._4_4_ < *(int *)&_bLive->xBestIndex && aPopulator._4_4_ == 0;
          z._4_4_ = z._4_4_ + 1) {
        aPopulator._4_4_ =
             fts5ApiColumnText((Fts5Context *)pFStack_10,z._4_4_,(char **)&pSorter,(int *)&z);
        if (aPopulator._4_4_ == 0) {
          aPopulator._4_4_ =
               sqlite3Fts5ExprPopulatePoslists
                         ((Fts5Config *)_bLive,pFStack_10->pExpr,_n,z._4_4_,(char *)pSorter,(int)z);
        }
      }
      sqlite3_free(_n);
      if (pFStack_10->pSorter != (Fts5Sorter *)0x0) {
        sqlite3Fts5ExprCheckPoslists(pFStack_10->pExpr,pFStack_10->pSorter->iRowid);
      }
    }
    pFStack_10->csrflags = pFStack_10->csrflags & 0xffffffbf;
  }
  if ((pFStack_10->pSorter == (Fts5Sorter *)0x0) || (*(int *)((long)&_bLive->xColumn + 4) != 0)) {
    iVar2 = sqlite3Fts5ExprPoslist(pFStack_10->pExpr,pa_local._4_4_,(u8 **)pn_local);
    *(int *)&pConfig->db = iVar2;
  }
  else {
    pFVar1 = pFStack_10->pSorter;
    if (pa_local._4_4_ == 0) {
      local_64 = 0;
    }
    else {
      local_64 = pFVar1->aIdx[pa_local._4_4_ + -1];
    }
    *(int *)&pConfig->db = pFVar1->aIdx[pa_local._4_4_] - local_64;
    *(u8 **)pn_local = pFVar1->aPoslist + local_64;
  }
  return aPopulator._4_4_;
}

Assistant:

static int fts5CsrPoslist(
  Fts5Cursor *pCsr, 
  int iPhrase, 
  const u8 **pa,
  int *pn
){
  Fts5Config *pConfig = ((Fts5Table*)(pCsr->base.pVtab))->pConfig;
  int rc = SQLITE_OK;
  int bLive = (pCsr->pSorter==0);

  if( CsrFlagTest(pCsr, FTS5CSR_REQUIRE_POSLIST) ){

    if( pConfig->eDetail!=FTS5_DETAIL_FULL ){
      Fts5PoslistPopulator *aPopulator;
      int i;
      aPopulator = sqlite3Fts5ExprClearPoslists(pCsr->pExpr, bLive);
      if( aPopulator==0 ) rc = SQLITE_NOMEM;
      for(i=0; i<pConfig->nCol && rc==SQLITE_OK; i++){
        int n; const char *z;
        rc = fts5ApiColumnText((Fts5Context*)pCsr, i, &z, &n);
        if( rc==SQLITE_OK ){
          rc = sqlite3Fts5ExprPopulatePoslists(
              pConfig, pCsr->pExpr, aPopulator, i, z, n
          );
        }
      }
      sqlite3_free(aPopulator);

      if( pCsr->pSorter ){
        sqlite3Fts5ExprCheckPoslists(pCsr->pExpr, pCsr->pSorter->iRowid);
      }
    }
    CsrFlagClear(pCsr, FTS5CSR_REQUIRE_POSLIST);
  }

  if( pCsr->pSorter && pConfig->eDetail==FTS5_DETAIL_FULL ){
    Fts5Sorter *pSorter = pCsr->pSorter;
    int i1 = (iPhrase==0 ? 0 : pSorter->aIdx[iPhrase-1]);
    *pn = pSorter->aIdx[iPhrase] - i1;
    *pa = &pSorter->aPoslist[i1];
  }else{
    *pn = sqlite3Fts5ExprPoslist(pCsr->pExpr, iPhrase, pa);
  }

  return rc;
}